

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDeriveWithOnePo(Abc_Ntk_t *pNtk,Vec_Int_t *vNodeIds,Vec_Int_t *vNodeValues)

{
  long *plVar1;
  Vec_Ptr_t *vFanins;
  void **ppvVar2;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  
  vFanins = (Vec_Ptr_t *)malloc(0x10);
  vFanins->nCap = 100;
  vFanins->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vFanins->pArray = ppvVar2;
  pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar3;
  pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar3;
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      if (pVVar6->pArray[lVar8] != (void *)0x0) {
        *(undefined8 *)((long)pVVar6->pArray[lVar8] + 0x40) = 0;
        pVVar6 = pNtk->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar6->nSize);
  }
  if ((pNtk->ntkType == ABC_NTK_STRASH) && (pNtk_00->ntkType == ABC_NTK_STRASH)) {
    pAVar4 = Abc_AigConst1(pNtk_00);
    pAVar5 = Abc_AigConst1(pNtk);
    (pAVar5->field_6).pCopy = pAVar4;
  }
  pVVar6 = pNtk->vPis;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      Abc_NtkDupObj(pNtk_00,(Abc_Obj_t *)pVVar6->pArray[lVar8],1);
      lVar8 = lVar8 + 1;
      pVVar6 = pNtk->vPis;
    } while (lVar8 < pVVar6->nSize);
  }
  pAVar4 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
  Abc_ObjAssignName(pAVar4,"monitor",(char *)0x0);
  pVVar6 = pNtk->vBoxes;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      Abc_NtkDupBox(pNtk_00,(Abc_Obj_t *)pVVar6->pArray[lVar8],1);
      lVar8 = lVar8 + 1;
      pVVar6 = pNtk->vBoxes;
    } while (lVar8 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)pVVar6->pArray[lVar8];
      if (((pAVar4 != (Abc_Obj_t *)0x0) && ((pAVar4->field_6).pTemp == (void *)0x0)) &&
         ((*(uint *)&pAVar4->field_0x14 & 0xf) != 3)) {
        Abc_NtkDupObj(pNtk_00,pAVar4,0);
        pVVar6 = pNtk->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar6->nSize);
    if (0 < pVVar6->nSize) {
      lVar8 = 0;
      do {
        plVar1 = (long *)pVVar6->pArray[lVar8];
        if (((plVar1 != (long *)0x0) &&
            (uVar7 = *(uint *)((long)plVar1 + 0x14) & 0xf,
            (*(uint *)((long)plVar1 + 0x14) & 0xe) != 8 && uVar7 != 3)) &&
           ((uVar7 != 5 && ((uVar7 != 10 && (0 < *(int *)((long)plVar1 + 0x1c))))))) {
          lVar9 = 0;
          do {
            Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],
                            *(Abc_Obj_t **)
                             (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                       (long)*(int *)(plVar1[4] + lVar9 * 4) * 8) + 0x40));
            lVar9 = lVar9 + 1;
          } while (lVar9 < *(int *)((long)plVar1 + 0x1c));
          pVVar6 = pNtk->vObjs;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < pVVar6->nSize);
    }
  }
  if (vNodeIds->nSize < 1) {
    pAVar4 = (Abc_Obj_t *)0x0;
  }
  else {
    lVar8 = 0;
    pAVar5 = (Abc_Obj_t *)0x0;
    do {
      if (vNodeValues->nSize <= lVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = vNodeIds->pArray[lVar8];
      if (((int)uVar7 < 0) || (pNtk->vObjs->nSize <= (int)uVar7)) goto LAB_00834ee3;
      pAVar4 = *(Abc_Obj_t **)((long)pNtk->vObjs->pArray[uVar7] + 0x40);
      if (vNodeValues->pArray[lVar8] == 0) {
        pAVar4 = Abc_NtkCreateNodeInv(pNtk_00,pAVar4);
      }
      if (pAVar5 != (Abc_Obj_t *)0x0) {
        ppvVar2 = vFanins->pArray;
        if (vFanins->nCap < 2) {
          if (ppvVar2 == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x10);
          }
          else {
            ppvVar2 = (void **)realloc(ppvVar2,0x10);
          }
          vFanins->pArray = ppvVar2;
          vFanins->nCap = 2;
        }
        *ppvVar2 = pAVar5;
        vFanins->pArray[1] = pAVar4;
        vFanins->nSize = 2;
        pAVar4 = Abc_NtkCreateNodeAnd(pNtk_00,vFanins);
      }
      lVar8 = lVar8 + 1;
      pAVar5 = pAVar4;
    } while (lVar8 < vNodeIds->nSize);
    ppvVar2 = vFanins->pArray;
  }
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(vFanins);
  if (0 < pNtk_00->vPos->nSize) {
    Abc_ObjAddFanin((Abc_Obj_t *)*pNtk_00->vPos->pArray,pAVar4);
    if (pNtk_00->vPos->nSize != 1) {
      __assert_fail("Abc_NtkPoNum(pNtkNew) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                    ,0xbbe,
                    "Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (pNtk_00->vCis->nSize != pNtk->vCis->nSize) {
      __assert_fail("Abc_NtkCiNum(pNtkNew) == Abc_NtkCiNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                    ,0xbbf,
                    "Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    if (pNtk_00->nObjCounts[8] != pNtk->nObjCounts[8]) {
      __assert_fail("Abc_NtkLatchNum(pNtkNew) == Abc_NtkLatchNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                    ,0xbc0,
                    "Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
    }
    return pNtk_00;
  }
LAB_00834ee3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDeriveWithOnePo( Abc_Ntk_t * pNtk, Vec_Int_t * vNodeIds, Vec_Int_t * vNodeValues )
{
    int fCopyNames = 1;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pObjNew, * pOutputNew;
    Vec_Ptr_t * vFanins = Vec_PtrAlloc( 100 );
    int i, k, Id, Value;
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    //Abc_NtkForEachPo( pNtk, pObj, i )
    //    Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    // create one PO
    pObjNew = Abc_NtkCreateObj( pNtkNew, ABC_OBJ_PO );
    Abc_ObjAssignName( pObjNew, "monitor", NULL );
    // create boxes
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, fCopyNames );

    // duplicate nodes (CIs/COs/latches are already duplicated)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL && !Abc_ObjIsPo(pObj) )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects except boxes (they are already connected) and POs (they will be connected later)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsPo(pObj) && !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // AND nodes (with interters if needed)
    pOutputNew = NULL;
    Vec_IntForEachEntryTwo( vNodeIds, vNodeValues, Id, Value, i )
    {
        pObjNew = Abc_NtkObj( pNtk, Id )->pCopy;
        if ( Value == 0 ) // negative polarity - add inverter
            pObjNew = Abc_NtkCreateNodeInv( pNtkNew, pObjNew );
        if ( pOutputNew == NULL )
            pOutputNew = pObjNew;
        else
        {
            Vec_PtrFillTwo( vFanins, 2, pOutputNew, pObjNew );
            pOutputNew = Abc_NtkCreateNodeAnd( pNtkNew, vFanins );
        }
    }
    Vec_PtrFree( vFanins );
    // create the only POs, which is the AND of the corresponding nodes
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew, 0), pOutputNew );

    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkPoNum(pNtkNew)    == 1 );
    assert( Abc_NtkCiNum(pNtkNew)    == Abc_NtkCiNum(pNtk) );
    assert( Abc_NtkLatchNum(pNtkNew) == Abc_NtkLatchNum(pNtk) );
    return pNtkNew;
}